

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrlist.h
# Opt level: O3

void __thiscall icu_63::NFRuleList::add(NFRuleList *this,NFRule *thing)

{
  NFRule **ppNVar1;
  uint32_t uVar2;
  uint uVar3;
  
  if (this->fCount == this->fCapacity) {
    uVar3 = this->fCount + 10;
    this->fCapacity = uVar3;
    ppNVar1 = (NFRule **)uprv_realloc_63(this->fStuff,(ulong)uVar3 << 3);
    this->fStuff = ppNVar1;
  }
  else {
    ppNVar1 = this->fStuff;
  }
  if (ppNVar1 == (NFRule **)0x0) {
    this->fCapacity = 0;
    uVar2 = 0;
  }
  else {
    uVar2 = this->fCount + 1;
    ppNVar1[this->fCount] = thing;
  }
  this->fCount = uVar2;
  return;
}

Assistant:

void add(NFRule* thing) {
        if (fCount == fCapacity) {
            fCapacity += 10;
            fStuff = (NFRule**)uprv_realloc(fStuff, fCapacity * sizeof(NFRule*)); // assume success
        }
        if (fStuff != NULL) {
        	fStuff[fCount++] = thing;
        } else {
        	fCapacity = 0;
        	fCount = 0;
        }
    }